

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O2

bool pstore::http::check_message_complete<WsServer_Ping_Test::TestBody()::__2,int>
               (anon_class_8_1_65350a3f sender,int io,frame *wsp,opcode *op,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *payload)

{
  pointer puVar1;
  anon_class_8_1_65350a3f sender_00;
  bool bVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  span<const_unsigned_char,__1L> *in_R9;
  opcode io_00;
  error_code eVar4;
  error_or<int> eo3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_68;
  span<unsigned_char_const,_1l> local_58 [16];
  error_or<int> local_48;
  
  if (wsp->fin == true) {
    sender_00.output._4_4_ = 0;
    sender_00.output._0_4_ = io;
    io_00 = *op;
    if (io_00 == text) {
      pvVar3 = payload;
      bVar2 = is_valid_utf8<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )(payload->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )(payload->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish);
      if (!bVar2) {
        send_close_frame<WsServer_Ping_Test::TestBody()::__2,int>
                  (&local_48,(http *)sender.output,sender_00,0x3ef,(close_status_code)pvVar3);
        error_or<int>::~error_or(&local_48);
        return false;
      }
      io_00 = *op;
    }
    local_68 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               pstore::gsl::make_span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         (payload);
    pstore::gsl::span<unsigned_char_const,-1l>::span<unsigned_char,_1l>
              (local_58,(span<unsigned_char,__1L> *)&local_68);
    send_message<WsServer_Ping_Test::TestBody()::__2,int>
              (&eo3,(http *)sender.output,sender_00,io_00,(opcode)local_58,in_R9);
    if (eo3.has_error_ == true) {
      eVar4 = error_or<int>::get_error(&eo3);
      (**(code **)(*(long *)eVar4._M_cat + 0x20))(&local_88,eVar4._M_cat,eVar4._M_value);
      log<std::__cxx11::string>(error,"Send error: ",&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    puVar1 = (payload->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((payload->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (payload->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    *op = unknown;
    error_or<int>::~error_or(&eo3);
  }
  return true;
}

Assistant:

bool check_message_complete (Sender const sender, IO const io, frame const & wsp,
                                     opcode & op, std::vector<std::uint8_t> & payload) {
            if (wsp.fin) {
                // We've got the complete message. If this was a text message, we need to
                // validate the UTF-8 that it contains.
                //
                // "When an endpoint is to interpret a byte stream as UTF-8 but finds that
                // the byte stream is not, in fact, a valid UTF-8 stream, that endpoint MUST
                // _Fail the WebSocket Connection_.
                if (op == opcode::text &&
                    !is_valid_utf8 (std::begin (payload), std::end (payload))) {

                    send_close_frame (sender, io, close_status_code::invalid_payload);
                    return false;
                }

                if (log_received_messages) {
                    std::string str;
                    std::transform (std::begin (payload), std::end (payload),
                                    std::back_inserter (str),
                                    [] (std::uint8_t const v) { return static_cast<char> (v); });
                    log (logger::priority::info, "Received: ", str);
                }

                // This implements a simple echo server ATM.
                error_or<IO> const eo3 = send_message (sender, io, op, gsl::make_span (payload));
                if (!eo3) {
                    log (logger::priority::error, "Send error: ", eo3.get_error ().message ());
                }

                payload.clear ();
                op = opcode::unknown;
            }
            return true;
        }